

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ru_vine_swap.h
# Opt level: O1

void __thiscall
Gudhi::persistence_matrix::
RU_vine_swap<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_true>_>_>
::_swap_at_index(RU_vine_swap<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_true>_>_>
                 *this,Index columnIndex)

{
  __node_base_ptr p_Var1;
  node_ptr plVar2;
  node_ptr other_node;
  undefined4 uVar3;
  size_type sVar4;
  node_ptr plVar5;
  __buckets_ptr pp_Var6;
  iterator iVar7;
  long lVar8;
  _List_node_base *p_Var9;
  __node_base_ptr p_Var10;
  __node_base_ptr p_Var11;
  uint uVar12;
  _Hash_node_base *p_Var13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  __node_base_ptr p_Var19;
  __node_base_ptr p_Var20;
  __hash_code __code;
  uint uVar21;
  uint uVar22;
  ulong uVar23;
  ulong uVar24;
  __hash_code __code_1;
  uint local_50;
  uint local_4c;
  long local_48;
  long local_40;
  ulong local_38;
  
  uVar15 = (ulong)columnIndex;
  uVar23 = (ulong)columnIndex;
  sVar4 = this[1].super_type.indexToBar_._M_h._M_bucket_count;
  uVar14 = ((long)((long)this[1].super_type.indexToBar_._M_h._M_before_begin._M_nxt - sVar4) >> 3) *
           -0x3333333333333333;
  uVar24 = uVar23;
  if (uVar23 <= uVar14 && uVar14 - uVar23 != 0) {
    uVar21 = columnIndex + 1;
    uVar16 = (ulong)uVar21;
    uVar24 = uVar16;
    if (uVar16 <= uVar14 && uVar14 - uVar16 != 0) {
      local_48 = uVar23 * 5;
      local_40 = uVar16 * 5;
      plVar2 = (node_ptr)(sVar4 + 0x18 + uVar23 * 0x28);
      uVar3 = *(undefined4 *)&plVar2[-2].prev_;
      other_node = (node_ptr)(sVar4 + 0x18 + uVar16 * 0x28);
      *(undefined4 *)&plVar2[-2].prev_ = *(undefined4 *)&other_node[-2].prev_;
      *(undefined4 *)&other_node[-2].prev_ = uVar3;
      boost::intrusive::circular_list_algorithms<boost::intrusive::list_node_traits<void_*>_>::
      swap_nodes(plVar2,other_node);
      plVar5 = plVar2[-1].next_;
      plVar2[-1].next_ = other_node[-1].next_;
      other_node[-1].next_ = plVar5;
      plVar5 = plVar2[-1].prev_;
      plVar2[-1].prev_ = other_node[-1].prev_;
      other_node[-1].prev_ = plVar5;
      pp_Var6 = (this->super_type).super_type.map_._M_h._M_buckets;
      uVar24 = (this->super_type).super_type.map_._M_h._M_bucket_count;
      p_Var19 = pp_Var6[uVar23 % uVar24];
      p_Var20 = (__node_base_ptr)0x0;
      if ((p_Var19 != (__node_base_ptr)0x0) &&
         (p_Var13 = p_Var19->_M_nxt, p_Var20 = p_Var19,
         *(Index *)&p_Var19->_M_nxt[1]._M_nxt != columnIndex)) {
        while (p_Var19 = p_Var13, p_Var13 = p_Var19->_M_nxt, p_Var13 != (_Hash_node_base *)0x0) {
          p_Var20 = (__node_base_ptr)0x0;
          if (((ulong)*(uint *)&p_Var13[1]._M_nxt % uVar24 != uVar23 % uVar24) ||
             (p_Var20 = p_Var19, *(uint *)&p_Var13[1]._M_nxt == columnIndex)) goto LAB_0015dd3d;
        }
        p_Var20 = (__node_base_ptr)0x0;
      }
LAB_0015dd3d:
      if (p_Var20 == (__node_base_ptr)0x0) {
        p_Var13 = (_Hash_node_base *)0x0;
      }
      else {
        p_Var13 = p_Var20->_M_nxt;
      }
      if (p_Var13 != (_Hash_node_base *)0x0) {
        columnIndex = *(uint *)((long)&p_Var13[1]._M_nxt + 4);
      }
      p_Var19 = pp_Var6[uVar16 % uVar24];
      p_Var20 = (__node_base_ptr)0x0;
      if ((p_Var19 != (__node_base_ptr)0x0) &&
         (p_Var13 = p_Var19->_M_nxt, p_Var20 = p_Var19,
         *(uint *)&p_Var19->_M_nxt[1]._M_nxt != uVar21)) {
        while (p_Var19 = p_Var13, p_Var13 = p_Var19->_M_nxt, p_Var13 != (_Hash_node_base *)0x0) {
          p_Var20 = (__node_base_ptr)0x0;
          if (((ulong)*(uint *)&p_Var13[1]._M_nxt % uVar24 != uVar16 % uVar24) ||
             (p_Var20 = p_Var19, *(uint *)&p_Var13[1]._M_nxt == uVar21)) goto LAB_0015ddab;
        }
        p_Var20 = (__node_base_ptr)0x0;
      }
LAB_0015ddab:
      if (p_Var20 == (__node_base_ptr)0x0) {
        p_Var13 = (_Hash_node_base *)0x0;
      }
      else {
        p_Var13 = p_Var20->_M_nxt;
      }
      uVar22 = uVar21;
      if (p_Var13 != (_Hash_node_base *)0x0) {
        uVar22 = *(uint *)((long)&p_Var13[1]._M_nxt + 4);
      }
      *(undefined1 *)&this[1].super_type.indexToBar_._M_h._M_buckets = 1;
      uVar24 = (long)(this[1].super_type.super_type.map_._M_h._M_rehash_policy._M_next_resize -
                     *(long *)&this[1].super_type.super_type.map_._M_h._M_rehash_policy) >> 2;
      uVar12 = uVar22;
      if (uVar22 < columnIndex) {
        uVar12 = columnIndex;
      }
      local_38 = uVar15;
      if (uVar24 <= uVar12) {
        do {
          local_50 = (uint)uVar24;
          iVar7._M_current =
               (uint *)this[1].super_type.super_type.map_._M_h._M_rehash_policy._M_next_resize;
          if ((__node_base_ptr)iVar7._M_current ==
              this[1].super_type.super_type.map_._M_h._M_single_bucket) {
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
            _M_realloc_insert<unsigned_int>
                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                       &this[1].super_type.super_type.map_._M_h._M_rehash_policy,iVar7,&local_50);
          }
          else {
            *iVar7._M_current = local_50;
            this[1].super_type.super_type.map_._M_h._M_rehash_policy._M_next_resize =
                 (size_t)(iVar7._M_current + 1);
          }
          uVar24 = uVar24 + 1;
        } while ((ulong)uVar12 + 1 != uVar24);
      }
      uVar14 = local_38;
      uVar24 = (ulong)columnIndex;
      lVar8 = *(long *)&this[1].super_type.super_type.map_._M_h._M_rehash_policy;
      p_Var9 = this[1].super_type.barcode_.
               super__List_base<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>,_std::allocator<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>_>_>
               ._M_impl._M_node.super__List_node_base._M_next;
      uVar15 = (ulong)*(uint *)(lVar8 + uVar24 * 4);
      uVar17 = (ulong)uVar22;
      uVar18 = (ulong)*(uint *)(lVar8 + uVar17 * 4);
      uVar3 = *(undefined4 *)((long)&p_Var9->_M_next + uVar15 * 4);
      *(undefined4 *)((long)&p_Var9->_M_next + uVar15 * 4) =
           *(undefined4 *)((long)&p_Var9->_M_next + uVar18 * 4);
      *(undefined4 *)((long)&p_Var9->_M_next + uVar18 * 4) = uVar3;
      uVar3 = *(undefined4 *)(lVar8 + uVar24 * 4);
      *(undefined4 *)(lVar8 + uVar24 * 4) = *(undefined4 *)(lVar8 + uVar17 * 4);
      *(undefined4 *)(lVar8 + uVar17 * 4) = uVar3;
      p_Var10 = this[1].super_type.idToPosition_._M_h._M_single_bucket;
      uVar15 = ((long)this[2].super_type.super_type.map_._M_h._M_buckets - (long)p_Var10 >> 3) *
               -0x3333333333333333;
      uVar24 = uVar23;
      if ((uVar23 <= uVar15 && uVar15 - uVar23 != 0) &&
         (uVar24 = uVar16, uVar16 <= uVar15 && uVar15 - uVar16 != 0)) {
        p_Var1 = p_Var10 + local_48;
        uVar3 = *(undefined4 *)&p_Var1->_M_nxt;
        plVar2 = (node_ptr)(p_Var10 + local_40 + 3);
        *(undefined4 *)&p_Var1->_M_nxt = *(undefined4 *)&plVar2[-2].prev_;
        *(undefined4 *)&plVar2[-2].prev_ = uVar3;
        boost::intrusive::circular_list_algorithms<boost::intrusive::list_node_traits<void_*>_>::
        swap_nodes((node_ptr)(p_Var1 + 3),plVar2);
        plVar5 = (node_ptr)p_Var1[1]._M_nxt;
        p_Var1[1]._M_nxt = (_Hash_node_base *)plVar2[-1].next_;
        plVar2[-1].next_ = plVar5;
        plVar5 = (node_ptr)p_Var1[2]._M_nxt;
        p_Var1[2]._M_nxt = (_Hash_node_base *)plVar2[-1].prev_;
        plVar2[-1].prev_ = plVar5;
        pp_Var6 = (this->super_type).super_type.map_._M_h._M_buckets;
        uVar24 = (this->super_type).super_type.map_._M_h._M_bucket_count;
        p_Var19 = pp_Var6[uVar23 % uVar24];
        p_Var20 = (__node_base_ptr)0x0;
        if (p_Var19 != (__node_base_ptr)0x0) {
          p_Var13 = p_Var19->_M_nxt;
          p_Var20 = p_Var19;
          if (*(uint *)&p_Var19->_M_nxt[1]._M_nxt != (uint)uVar14) {
            while (p_Var19 = p_Var13, p_Var13 = p_Var19->_M_nxt, p_Var13 != (_Hash_node_base *)0x0)
            {
              p_Var20 = (__node_base_ptr)0x0;
              if (((ulong)*(uint *)&p_Var13[1]._M_nxt % uVar24 != uVar23 % uVar24) ||
                 (p_Var20 = p_Var19, *(uint *)&p_Var13[1]._M_nxt == (uint)uVar14))
              goto LAB_0015df63;
            }
            p_Var20 = (__node_base_ptr)0x0;
          }
        }
LAB_0015df63:
        if (p_Var20 == (__node_base_ptr)0x0) {
          p_Var13 = (_Hash_node_base *)0x0;
        }
        else {
          p_Var13 = p_Var20->_M_nxt;
        }
        if (p_Var13 != (_Hash_node_base *)0x0) {
          uVar14 = (ulong)*(uint *)((long)&p_Var13[1]._M_nxt + 4);
        }
        p_Var19 = pp_Var6[uVar16 % uVar24];
        p_Var20 = (__node_base_ptr)0x0;
        if ((p_Var19 != (__node_base_ptr)0x0) &&
           (p_Var13 = p_Var19->_M_nxt, p_Var20 = p_Var19,
           *(uint *)&p_Var19->_M_nxt[1]._M_nxt != uVar21)) {
          while (p_Var19 = p_Var13, p_Var13 = p_Var19->_M_nxt, p_Var13 != (_Hash_node_base *)0x0) {
            p_Var20 = (__node_base_ptr)0x0;
            if (((ulong)*(uint *)&p_Var13[1]._M_nxt % uVar24 != uVar16 % uVar24) ||
               (p_Var20 = p_Var19, *(uint *)&p_Var13[1]._M_nxt == uVar21)) goto LAB_0015dfcc;
          }
          p_Var20 = (__node_base_ptr)0x0;
        }
LAB_0015dfcc:
        if (p_Var20 == (__node_base_ptr)0x0) {
          p_Var13 = (_Hash_node_base *)0x0;
        }
        else {
          p_Var13 = p_Var20->_M_nxt;
        }
        if (p_Var13 != (_Hash_node_base *)0x0) {
          uVar21 = *(uint *)((long)&p_Var13[1]._M_nxt + 4);
        }
        *(undefined1 *)&this[1].super_type.idToPosition_._M_h._M_rehash_policy._M_next_resize = 1;
        uVar24 = (long)this[1].super_type.idToPosition_._M_h._M_buckets -
                 (long)this[1].super_type.indexToBar_._M_h._M_single_bucket >> 2;
        uVar23 = (ulong)uVar21;
        if (uVar21 < (uint)uVar14) {
          uVar23 = uVar14 & 0xffffffff;
        }
        if (uVar24 <= uVar23) {
          do {
            local_4c = (uint)uVar24;
            iVar7._M_current = (uint *)this[1].super_type.idToPosition_._M_h._M_buckets;
            if (iVar7._M_current == (uint *)this[1].super_type.idToPosition_._M_h._M_bucket_count) {
              std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
              _M_realloc_insert<unsigned_int>
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                         &this[1].super_type.indexToBar_._M_h._M_single_bucket,iVar7,&local_4c);
            }
            else {
              *iVar7._M_current = local_4c;
              this[1].super_type.idToPosition_._M_h._M_buckets =
                   (__buckets_ptr)(iVar7._M_current + 1);
            }
            uVar24 = uVar24 + 1;
          } while (uVar23 + 1 != uVar24);
        }
        uVar14 = uVar14 & 0xffffffff;
        p_Var11 = this[1].super_type.indexToBar_._M_h._M_single_bucket;
        p_Var13 = this[1].super_type.idToPosition_._M_h._M_before_begin._M_nxt;
        uVar24 = (ulong)*(uint *)((long)&p_Var11->_M_nxt + uVar14 * 4);
        uVar23 = (ulong)uVar21;
        uVar15 = (ulong)*(uint *)((long)&p_Var11->_M_nxt + uVar23 * 4);
        uVar3 = *(undefined4 *)((long)&p_Var13->_M_nxt + uVar24 * 4);
        *(undefined4 *)((long)&p_Var13->_M_nxt + uVar24 * 4) =
             *(undefined4 *)((long)&p_Var13->_M_nxt + uVar15 * 4);
        *(undefined4 *)((long)&p_Var13->_M_nxt + uVar15 * 4) = uVar3;
        uVar3 = *(undefined4 *)((long)&p_Var11->_M_nxt + uVar14 * 4);
        *(undefined4 *)((long)&p_Var11->_M_nxt + uVar14 * 4) =
             *(undefined4 *)((long)&p_Var11->_M_nxt + uVar23 * 4);
        *(undefined4 *)((long)&p_Var11->_M_nxt + uVar23 * 4) = uVar3;
        return;
      }
    }
  }
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar24);
}

Assistant:

inline void RU_vine_swap<Master_matrix>::_swap_at_index(Index columnIndex)
{
  _matrix()->reducedMatrixR_.swap_columns(columnIndex, columnIndex + 1);
  _matrix()->reducedMatrixR_.swap_rows(_get_row_id_from_position(columnIndex),
                                       _get_row_id_from_position(columnIndex + 1));
  _matrix()->mirrorMatrixU_.swap_columns(columnIndex, columnIndex + 1);
  _matrix()->mirrorMatrixU_.swap_rows(_get_row_id_from_position(columnIndex),
                                      _get_row_id_from_position(columnIndex + 1));
}